

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart.hpp
# Opt level: O0

Lazy<cinatra::part_head_t> __thiscall
cinatra::multipart_reader_t<cinatra::coro_http_client>::read_part_head
          (multipart_reader_t<cinatra::coro_http_client> *this,string_view boundary)

{
  long lVar1;
  string_view name;
  string_view name_00;
  string_view data;
  string_view data_00;
  string_view delim;
  bool bVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 *extraout_RAX;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  ptVar6;
  char *pcVar7;
  size_type sVar8;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  size_t in_RDX;
  int __fd;
  undefined8 in_RSI;
  LazyBase<cinatra::part_head_t,_false> in_RDI;
  const_buffer cVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t pos_1;
  size_t pos;
  char *data_ptr_1;
  char *data_ptr;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  basic_streambuf<std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  int in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int local_420;
  int local_418;
  int local_400;
  
  puVar3 = (undefined8 *)operator_new(0x1b8,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::part_head_t>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar3 = read_part_head;
  puVar3[1] = read_part_head;
  puVar3[0x35] = in_RSI;
  ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x1d))->_M_len = in_RDX;
  puVar3[0x1e] = in_RCX;
  async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::LazyPromise
            ((LazyPromise<cinatra::part_head_t> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::get_return_object
            ((LazyPromise<cinatra::part_head_t> *)
             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
  bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x1b5));
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0x1b4) = 0;
    cinatra::multipart_reader_t
              (in_stack_fffffffffffffb90,
               (void *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    return (Lazy<cinatra::part_head_t>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x1b5));
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x1d));
  if (bVar2) {
    std::make_error_code(0);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb90);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb90);
    async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::
    return_value<cinatra::part_head_t>
              ((LazyPromise<cinatra::part_head_t> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (part_head_t *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    part_head_t::~part_head_t
              ((part_head_t *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  }
  else {
    sVar4 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffb90);
    local_418 = in_stack_fffffffffffffba4;
    local_420 = in_stack_fffffffffffffba8;
    if (sVar4 != 0) {
      lVar1 = puVar3[0x35];
      asio::basic_streambuf<std::allocator<char>_>::data
                ((basic_streambuf<std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x3f3a53);
      pcVar7 = *(char **)(lVar1 + 0x10);
      asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffb90);
      std::streambuf::sputn(pcVar7,(long)pcVar5);
      asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffffb90);
      asio::basic_streambuf<std::allocator<char>_>::consume
                ((basic_streambuf<std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_418 = in_stack_fffffffffffffba4;
      local_420 = in_stack_fffffffffffffba8;
    }
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb90);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb90);
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    *(undefined1 *)((long)puVar3 + 0x1b6) = 0;
    puVar3[0x21] = 6;
    puVar3[0x22] = "name=\"";
    puVar3[0x23] = 10;
    puVar3[0x24] = "filename=\"";
    do {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      delim._M_len._4_4_ = in_stack_fffffffffffffbb4;
      delim._M_len._0_4_ = in_stack_fffffffffffffbb0;
      delim._M_str._0_4_ = in_stack_fffffffffffffbb8;
      delim._M_str._4_4_ = in_stack_fffffffffffffbbc;
      coro_http_client::async_read_until<asio::basic_streambuf<std::allocator<char>>>
                ((coro_http_client *)CONCAT44(in_stack_fffffffffffffbac,local_420),
                 (basic_streambuf<std::allocator<char>_> *)
                 CONCAT44(local_418,in_stack_fffffffffffffba0),delim);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      bVar2 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar3 + 0x32));
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x1b4) = 1;
        cinatra::multipart_reader_t
                  ((void *)CONCAT44(local_418,in_stack_fffffffffffffba0),
                   (void *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        (*(code *)*extraout_RAX)(extraout_RAX);
        return (Lazy<cinatra::part_head_t>)in_RDI._coro.__handle_.__handle_;
      }
      puVar3[0x2f] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x32);
      async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
      awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                  CONCAT44(local_418,in_stack_fffffffffffffba0));
      std::tie<std::error_code,unsigned_long>
                ((error_code *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      __fd = (int)puVar3 + 0xd0;
      ptVar6 = std::tuple<std::error_code&,unsigned_long&>::operator=
                         ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffb90,
                          (pair<std::error_code,_unsigned_long> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      puVar3[0x34] = ptVar6;
      async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
      ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3f3d86);
      async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3f3d93);
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)(puVar3 + 0x1f));
      if (bVar2) {
        puVar3[0x10] = puVar3[0x1f];
        puVar3[0x11] = puVar3[0x20];
        coro_http_client::close(*(coro_http_client **)puVar3[0x35],__fd);
        async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::
        return_value<cinatra::part_head_t>
                  ((LazyPromise<cinatra::part_head_t> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (part_head_t *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        goto LAB_003f41b5;
      }
      cVar9 = (const_buffer)
              asio::basic_streambuf<std::allocator<char>_>::data
                        ((basic_streambuf<std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      *(const_buffer *)(puVar3 + 0x27) = cVar9;
      pcVar7 = asio::buffer_cast<char_const*>((const_buffer *)0x3f3e95);
      asio::basic_streambuf<std::allocator<char>_>::consume
                ((basic_streambuf<std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 CONCAT44(in_stack_fffffffffffffbac,local_420));
      if (*pcVar7 == '-') {
        local_418 = 4;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x29),pcVar7,
                   puVar3[0x31]);
        if (puVar3[0x31] == 2) {
          local_420 = 5;
        }
        else {
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(local_418,in_stack_fffffffffffffba0),
                             (char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                             (size_type)in_stack_fffffffffffffb90);
          if (sVar8 == 0xffffffffffffffff) {
            in_stack_fffffffffffffbb4 = 0;
            in_stack_fffffffffffffbb0 = 0;
          }
          else {
            data._M_len._4_4_ = in_stack_fffffffffffffbac;
            data._M_len._0_4_ = local_420;
            data._M_str._0_4_ = in_stack_fffffffffffffbb0;
            data._M_str._4_4_ = in_stack_fffffffffffffbb4;
            name._M_len._4_4_ = in_stack_fffffffffffffb9c;
            name._M_len._0_4_ = in_stack_fffffffffffffb98;
            name._M_str._0_4_ = in_stack_fffffffffffffba0;
            name._M_str._4_4_ = local_418;
            bVar10 = cinatra::multipart_reader_t::anon_class_1_0_00000001_for_get_part_name::
                     operator()((anon_class_1_0_00000001_for_get_part_name *)
                                in_stack_fffffffffffffb90,data,name,
                                CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            *(basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x2b) = bVar10;
            std::__cxx11::string::operator=
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(local_418,in_stack_fffffffffffffba0),
                               (char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)
                               ,(size_type)in_stack_fffffffffffffb90);
            if (sVar8 != 0xffffffffffffffff) {
              data_00._M_len._4_4_ = in_stack_fffffffffffffbac;
              data_00._M_len._0_4_ = local_420;
              data_00._M_str._0_4_ = in_stack_fffffffffffffbb0;
              data_00._M_str._4_4_ = in_stack_fffffffffffffbb4;
              name_00._M_len._4_4_ = in_stack_fffffffffffffb9c;
              name_00._M_len._0_4_ = in_stack_fffffffffffffb98;
              name_00._M_str._0_4_ = in_stack_fffffffffffffba0;
              name_00._M_str._4_4_ = local_418;
              bVar10 = cinatra::multipart_reader_t::anon_class_1_0_00000001_for_get_part_name::
                       operator()((anon_class_1_0_00000001_for_get_part_name *)
                                  in_stack_fffffffffffffb90,data_00,name_00,
                                  CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
              *(basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x2d) = bVar10;
              std::__cxx11::string::operator=
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            }
            in_stack_fffffffffffffbbc = 4;
            in_stack_fffffffffffffbb0 = 4;
          }
          in_stack_fffffffffffffbb8 = in_stack_fffffffffffffbb0;
          local_420 = in_stack_fffffffffffffbb0;
          if (in_stack_fffffffffffffbb0 == 0) {
            in_stack_fffffffffffffbac = 0;
            local_420 = 0;
          }
        }
        local_418 = local_420;
      }
    } while ((local_418 == 0) || (local_418 == 4));
    async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::
    return_value<cinatra::part_head_t>
              ((LazyPromise<cinatra::part_head_t> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (part_head_t *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
LAB_003f41b5:
    local_400 = 3;
    part_head_t::~part_head_t
              ((part_head_t *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    if (local_400 != 3) goto LAB_003f4332;
  }
  async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
  bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                    ((FinalAwaiter *)((long)puVar3 + 0x1b7));
  if (!bVar2) {
    *puVar3 = 0;
    *(undefined1 *)((long)puVar3 + 0x1b4) = 2;
    cinatra::multipart_reader_t
              (in_stack_fffffffffffffb90,
               (void *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    (*(code *)*extraout_RAX_00)(extraout_RAX_00);
    return (Lazy<cinatra::part_head_t>)in_RDI._coro.__handle_.__handle_;
  }
  async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
            ((FinalAwaiter *)((long)puVar3 + 0x1b7));
LAB_003f4332:
  async_simple::coro::detail::LazyPromise<cinatra::part_head_t>::~LazyPromise
            ((LazyPromise<cinatra::part_head_t> *)0x3f4349);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x1b8);
  }
  return (Lazy<cinatra::part_head_t>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<part_head_t> read_part_head(
      std::string_view boundary) {
    if (boundary.empty()) {
      co_return part_head_t{std::make_error_code(std::errc::protocol_error)};
    }

    if (head_buf_.size() > 0) {
      const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      chunked_buf_.sputn(data_ptr, head_buf_.size());
      head_buf_.consume(head_buf_.size());
    }

    part_head_t result{};
    std::error_code ec{};
    size_t size;

    auto get_part_name = [](std::string_view data, std::string_view name,
                            size_t start) {
      start += name.length();
      size_t end = data.find("\"", start);
      return data.substr(start, end - start);
    };

    constexpr std::string_view name = "name=\"";
    constexpr std::string_view filename = "filename=\"";

    while (true) {
      if (std::tie(ec, size) =
              co_await conn_->async_read_until(chunked_buf_, CRCF);
          ec) {
        result.ec = ec;
        conn_->close();
        co_return result;
      }

      const char *data_ptr =
          asio::buffer_cast<const char *>(chunked_buf_.data());
      chunked_buf_.consume(size);
      if (*data_ptr == '-') {
        continue;
      }
      std::string_view data{data_ptr, size};
      if (size == 2) {  // got the head end: \r\n\r\n
        break;
      }

      if (size_t pos = data.find("name"); pos != std::string_view::npos) {
        result.name = get_part_name(data, name, pos);

        if (size_t pos = data.find("filename"); pos != std::string_view::npos) {
          result.filename = get_part_name(data, filename, pos);
        }
        continue;
      }
    }

    co_return result;
  }